

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

c_int osqp_update_check_termination(OSQPWorkspace *work,c_int check_termination_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_check_termination");
    return cVar1;
  }
  if (-1 < check_termination_new) {
    work->settings->check_termination = check_termination_new;
    return 0;
  }
  printf("ERROR in %s: ","osqp_update_check_termination");
  printf("check_termination should be nonnegative");
  putchar(10);
  return 1;
}

Assistant:

c_int osqp_update_check_termination(OSQPWorkspace *work, c_int check_termination_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that check_termination is nonnegative
  if (check_termination_new < 0) {
#ifdef PRINTING
    c_eprint("check_termination should be nonnegative");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update check_termination
  work->settings->check_termination = check_termination_new;

  return 0;
}